

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O3

Point2D __thiscall
lazyTrees::LazyKdTree<Point2D>::nearest(LazyKdTree<Point2D> *this,Point2D *search)

{
  Point2D *pPVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  bool bVar5;
  LazyKdTree<Point2D> *pLVar6;
  size_t sVar7;
  Point2D *this_00;
  double dVar8;
  Point2D PVar9;
  Point2D best;
  Point2D otherBest;
  Point2D local_68;
  double local_58;
  double local_50;
  double local_48;
  Point2D local_40;
  
  ensure_evaluated(this);
  this_00 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
            super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
            super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl !=
      (LazyKdTree<Point2D> *)0x0 ||
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl !=
      (LazyKdTree<Point2D> *)0x0) {
    sVar7 = this->dim;
    pdVar4 = Point2D::operator[](search,sVar7);
    local_58 = *pdVar4;
    pdVar4 = Point2D::operator[](this_00,sVar7);
    local_50 = *pdVar4;
    local_68.x = 0.0;
    local_68.y = 0.0;
    if (local_58 <= local_50) {
      pLVar6 = (this->childNegative)._M_t.
               super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
               .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    }
    else {
      pLVar6 = (this->childPositive)._M_t.
               super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
               .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    }
    if (pLVar6 == (LazyKdTree<Point2D> *)0x0) {
      this_00 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t
                .super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
    }
    else {
      PVar9 = nearest(pLVar6,search);
      local_68.y = PVar9.y;
      this_00 = &local_68;
      local_68.x = PVar9.x;
      dVar2 = 0.0;
      sVar7 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        pdVar4 = Point2D::operator[](search,sVar7);
        dVar8 = *pdVar4;
        pdVar4 = Point2D::operator[](this_00,sVar7);
        dVar2 = dVar2 + (dVar8 - *pdVar4) * (dVar8 - *pdVar4);
        sVar7 = 1;
        bVar3 = false;
      } while (bVar5);
      pPVar1 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
               super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
               super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
      dVar8 = 0.0;
      sVar7 = 0;
      bVar3 = true;
      do {
        bVar5 = bVar3;
        pdVar4 = Point2D::operator[](search,sVar7);
        local_48 = *pdVar4;
        pdVar4 = Point2D::operator[](pPVar1,sVar7);
        dVar8 = dVar8 + (local_48 - *pdVar4) * (local_48 - *pdVar4);
        sVar7 = 1;
        bVar3 = false;
      } while (bVar5);
      if (dVar8 < dVar2) {
        pPVar1 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                 _M_t.super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                 super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
        local_68.x = pPVar1->x;
        local_68.y = pPVar1->y;
        dVar2 = dVar8;
      }
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      pdVar4 = Point2D::operator[](search,this->dim);
      dVar8 = *pdVar4;
      pdVar4 = Point2D::operator[](search,this->dim);
      if ((local_50 < local_58) ||
         ((this->childPositive)._M_t.
          super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
          (LazyKdTree<Point2D> *)0x0)) {
        if ((local_58 <= local_50) ||
           ((this->childNegative)._M_t.
            super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
            .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
            (LazyKdTree<Point2D> *)0x0)) goto LAB_001436e7;
        pdVar4 = Point2D::operator[]((this->data)._M_t.
                                     super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>
                                     .super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim
                                    );
        if (*pdVar4 < dVar8 - dVar2) goto LAB_001436e7;
        pLVar6 = (this->childNegative)._M_t.
                 super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
      }
      else {
        dVar8 = *pdVar4;
        pdVar4 = Point2D::operator[]((this->data)._M_t.
                                     super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>
                                     .super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim
                                    );
        if (dVar2 + dVar8 < *pdVar4) goto LAB_001436e7;
        pLVar6 = (this->childPositive)._M_t.
                 super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
      }
      PVar9 = nearest(pLVar6,search);
      local_40.y = PVar9.y;
      local_40.x = PVar9.x;
      dVar2 = square_dist(search,&local_40);
      this_00 = &local_68;
      dVar8 = square_dist(search,this_00);
      if (dVar2 < dVar8) {
        local_68.x = local_40.x;
        local_68.y = local_40.y;
      }
    }
  }
LAB_001436e7:
  return *this_00;
}

Assistant:

P nearest(P const& search)
    {
        ensure_evaluated();

        if (is_leaf())
            return *data.get(); // reached the end, return current value

        const auto comp = dimension_compare(search, *data.get(), dim);

        P best; // nearest neighbor of search

        if (comp == NEGATIVE && childNegative)
            best = childNegative->nearest(search);
        else if (comp == POSITIVE && childPositive)
            best = childPositive->nearest(search);
        else
            return *data.get();

        double sqrDistanceBest = square_dist(search, best);
        const double sqrDistanceThis = square_dist(search, *data.get());

        if (sqrDistanceThis < sqrDistanceBest) {
            sqrDistanceBest = sqrDistanceThis;
            best = *data.get(); // make this value the best if it is closer than the
            // checked side
            // type
        }

        // check whether other side might have candidates as well
        const double distanceBest   = std::sqrt(sqrDistanceBest);
        const double borderNegative = search[dim] - distanceBest;
        const double borderPositive = search[dim] + distanceBest;

        // check whether distances to other side are smaller than currently best
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim]) {
                const auto otherBest = childPositive->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim]) {
                const auto otherBest = childNegative->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        }

        return best;
    }